

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O2

_Bool roaring_iterate64(roaring_bitmap_t *r,roaring_iterator64 iterator,uint64_t high_bits,void *ptr
                       )

{
  uint8_t uVar1;
  _Bool _Var2;
  long lVar3;
  uint32_t base;
  array_container_t *cont;
  int i;
  long lVar4;
  
  for (lVar4 = 0; lVar3 = (long)(r->high_low_container).size, lVar4 < lVar3; lVar4 = lVar4 + 1) {
    cont = (array_container_t *)(r->high_low_container).containers[lVar4];
    uVar1 = (r->high_low_container).typecodes[lVar4];
    if (uVar1 == '\x04') {
      uVar1 = *(uint8_t *)&cont->array;
      cont = *(array_container_t **)cont;
    }
    base = (uint)(r->high_low_container).keys[lVar4] << 0x10;
    if (uVar1 == '\x01') {
      _Var2 = bitset_container_iterate64((bitset_container_t *)cont,base,iterator,high_bits,ptr);
    }
    else if (uVar1 == '\x03') {
      _Var2 = run_container_iterate64((run_container_t *)cont,base,iterator,high_bits,ptr);
    }
    else {
      _Var2 = array_container_iterate64(cont,base,iterator,high_bits,ptr);
    }
    if (_Var2 == false) break;
  }
  return lVar3 <= lVar4;
}

Assistant:

bool roaring_iterate64(const roaring_bitmap_t *r, roaring_iterator64 iterator,
                       uint64_t high_bits, void *ptr) {
    const roaring_array_t *ra = &r->high_low_container;

    for (int i = 0; i < ra->size; ++i)
        if (!container_iterate64(ra->containers[i], ra->typecodes[i],
                                 ((uint32_t)ra->keys[i]) << 16, iterator,
                                 high_bits, ptr)) {
            return false;
        }
    return true;
}